

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O1

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,EndpointDeclaration *e)

{
  EndpointDetails *pEVar1;
  size_t sVar2;
  pool_ref<soul::AST::Expression> *ppVar3;
  ChildEndpointPath *pCVar4;
  PathSection *pPVar5;
  long lVar6;
  
  pEVar1 = (e->details).object;
  if (pEVar1 != (EndpointDetails *)0x0) {
    sVar2 = (pEVar1->dataTypes).numActive;
    if (sVar2 != 0) {
      ppVar3 = (pEVar1->dataTypes).items;
      lVar6 = 0;
      do {
        (*this->_vptr_ASTVisitor[3])(this,*(undefined8 *)((long)&ppVar3->object + lVar6));
        lVar6 = lVar6 + 8;
      } while (sVar2 << 3 != lVar6);
    }
    if ((pEVar1->arraySize).object != (Expression *)0x0) {
      (*this->_vptr_ASTVisitor[3])(this);
    }
  }
  pCVar4 = (e->childPath).object;
  if ((pCVar4 != (ChildEndpointPath *)0x0) && (sVar2 = (pCVar4->sections).numActive, sVar2 != 0)) {
    pPVar5 = (pCVar4->sections).items;
    lVar6 = 0;
    do {
      if (*(long *)((long)&(pPVar5->index).object + lVar6) != 0) {
        (*this->_vptr_ASTVisitor[3])(this);
      }
      lVar6 = lVar6 + 0x10;
    } while (sVar2 << 4 != lVar6);
  }
  (*this->_vptr_ASTVisitor[0xb])(this,&e->annotation);
  return;
}

Assistant:

virtual void visit (AST::EndpointDeclaration& e)
    {
        if (auto details = e.details.get())
        {
            for (auto& type : details->dataTypes)
                visitObject (type);

            visitObjectIfNotNull (details->arraySize);
        }

        if (e.childPath != nullptr)
            for (auto& p : e.childPath->sections)
                visitObjectIfNotNull (p.index);

        visit (e.annotation);
    }